

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void Object::clear_dead(void)

{
  uint uVar1;
  ulong uVar2;
  vector<Object_*,_std::allocator<Object_*>_> temp;
  _Vector_base<Object_*,_std::allocator<Object_*>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Object_*,_std::allocator<Object_*>_>::reserve
            ((vector<Object_*,_std::allocator<Object_*>_> *)&local_28,
             (long)obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  uVar1 = 0;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if ((ulong)((long)obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar2) break;
    if (obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar2]->on_map == true) {
      std::vector<Object_*,_std::allocator<Object_*>_>::push_back
                ((vector<Object_*,_std::allocator<Object_*>_> *)&local_28,
                 obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar2);
    }
    else {
      (*obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar2]->_vptr_Object[6])();
    }
    uVar1 = uVar1 + 1;
  }
  std::vector<Object_*,_std::allocator<Object_*>_>::operator=
            (&obj,(vector<Object_*,_std::allocator<Object_*>_> *)&local_28);
  std::_Vector_base<Object_*,_std::allocator<Object_*>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

Body::Body(const Point& p, PObject n){
	ch = CHR_BODY;
	position = p;
	next = n;
	obj.push_back(this);
	on_map = true;
}